

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool calculateSimilartyMap<stSampleMulti<short,4>>
               (int32_t keyPressWidth_samples,int32_t alignWindow_samples,
               int32_t offsetFromPeak_samples,TKeyPressCollectionT<TSampleMI16> *keyPresses,
               TSimilarityMap *res)

{
  pointer pvVar1;
  TSimilarityMap *__range1;
  long lVar2;
  vector<stMatch,_std::allocator<stMatch>_> *x;
  pointer this;
  pointer ptVar3;
  int iVar4;
  iterator __begin1;
  pointer ptVar5;
  int nWorkers;
  int a;
  int w;
  int nPresses;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  long *local_70;
  int local_64;
  int32_t local_60;
  int32_t local_5c;
  int local_58;
  int32_t local_54;
  thread local_50;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  iVar4 = (int)((long)(keyPresses->
                      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      ).
                      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(keyPresses->
                      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      ).
                      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
  local_60 = alignWindow_samples;
  local_5c = keyPressWidth_samples;
  local_58 = iVar4;
  local_54 = offsetFromPeak_samples;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::_M_erase_at_end(res,(res->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::resize(res,(long)iVar4);
  pvVar1 = (res->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this = (res->
              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pvVar1; this = this + 1) {
    std::vector<stMatch,_std::allocator<stMatch>_>::resize(this,(long)iVar4);
  }
  local_64 = std::thread::hardware_concurrency();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_48,(long)local_64,(allocator_type *)&local_70);
  ptVar3 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar5 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar2 = 0;
    do {
      ptVar3 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_50._M_id._M_thread = (id)0;
      local_70 = (long *)operator_new(0x48);
      *local_70 = (long)&PTR___State_001c2ac0;
      *(int *)(local_70 + 1) = (int)lVar2;
      local_70[2] = (long)&local_58;
      local_70[3] = (long)&local_64;
      local_70[4] = (long)res;
      local_70[5] = (long)keyPresses;
      local_70[6] = (long)&local_54;
      local_70[7] = (long)&local_5c;
      local_70[8] = (long)&local_60;
      std::thread::_M_start_thread(&local_50,&local_70,0);
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      if (ptVar3[lVar2]._M_id._M_thread != 0) {
        std::terminate();
      }
      ptVar3[lVar2]._M_id._M_thread = (native_handle_type)local_50._M_id._M_thread;
      lVar2 = lVar2 + 1;
      ptVar3 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar5 = local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)local_48.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  for (; ptVar5 != ptVar3; ptVar5 = ptVar5 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  return true;
}

Assistant:

bool calculateSimilartyMap(
        const int32_t keyPressWidth_samples,
        const int32_t alignWindow_samples,
        const int32_t offsetFromPeak_samples,
        TKeyPressCollectionT<TSampleMI16> & keyPresses,
        TSimilarityMap & res) {
    int nPresses = keyPresses.size();

    int w = keyPressWidth_samples;
    int a = alignWindow_samples;

    res.clear();
    res.resize(nPresses);
    for (auto & x : res) x.resize(nPresses);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(kMaxThreads, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::thread::hardware_concurrency();
#endif

    std::vector<std::thread> workers(nWorkers);
    for (int iw = 0; iw < (int) workers.size(); ++iw) {
        auto & worker = workers[iw];
        worker = std::thread([&](int ith) {
            for (int i = ith; i < nPresses; i += nWorkers) {
                res[i][i].cc = 1.0f;
                res[i][i].offset = 0;

                const auto & waveform0 = keyPresses[i].waveform;
                const auto & pos0      = keyPresses[i].pos;

                auto & avgcc = keyPresses[i].ccAvg;

                const auto samples0 = waveform0.samples;

                for (int j = i + 1; j < nPresses; ++j) {
                    if (i == j) continue;

                    const auto waveform1 = keyPresses[j].waveform;
                    const auto pos1      = keyPresses[j].pos;

                    const auto samples1 = waveform1.samples;
                    const auto ret = findBestCC(TWaveformViewT<TSampleMI16> { samples0 + pos0 + offsetFromPeak_samples - w,     2*w },
                                                TWaveformViewT<TSampleMI16> { samples1 + pos1 + offsetFromPeak_samples - w - a, 2*w + 2*a }, a);

                    const auto bestcc     = std::get<0>(ret);
                    const auto bestoffset = std::get<1>(ret);

                    res[i][j].cc = bestcc;
                    res[i][j].offset = bestoffset;

                    res[j][i].cc = bestcc;
                    res[j][i].offset = -bestoffset;

                    avgcc += bestcc;
                }
                avgcc /= (nPresses - 1);
            }
        }, iw);
    }

    for (auto & worker : workers) worker.join();

    return true;
}